

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  int iVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  ushort uVar24;
  ushort uVar25;
  Geometry *pGVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  RTCIntersectArguments *pRVar32;
  RTCFilterFunctionN p_Var33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  byte bVar52;
  undefined1 auVar53 [12];
  int iVar54;
  AABBNodeMB4D *node1;
  ulong uVar55;
  RTCRayN *pRVar56;
  RTCRayN *pRVar57;
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  undefined4 uVar63;
  ulong unaff_RBX;
  size_t mask;
  NodeRef *pNVar64;
  NodeRef *pNVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  long lVar72;
  size_t sVar73;
  ulong uVar74;
  RayK<4> *pRVar75;
  long lVar76;
  long lVar77;
  bool bVar78;
  bool bVar79;
  byte bVar80;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar102;
  uint uVar103;
  uint uVar121;
  uint uVar123;
  vint4 ai;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar125;
  undefined1 auVar108 [16];
  float fVar122;
  float fVar124;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar126;
  uint uVar127;
  uint uVar133;
  uint uVar134;
  vint4 ai_2;
  undefined1 auVar128 [16];
  uint uVar135;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  uint uVar136;
  uint uVar141;
  uint uVar142;
  vint4 bi;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar143;
  undefined1 auVar140 [16];
  vint4 ai_5;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar151;
  float fVar160;
  float fVar162;
  vint4 ai_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar167;
  uint uVar168;
  float fVar176;
  uint uVar178;
  vint4 bi_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  uint uVar177;
  uint uVar179;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar191;
  float fVar195;
  vint4 ai_7;
  undefined1 auVar184 [16];
  float fVar181;
  float fVar200;
  undefined1 auVar185 [16];
  float fVar192;
  float fVar196;
  float fVar201;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar193;
  float fVar194;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar210 [16];
  float fVar215;
  float fVar219;
  float fVar223;
  undefined1 auVar211 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar239;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar257 [16];
  float fVar262;
  UVIdentity<4> mapUV;
  RTCRayN *local_cd8;
  float fStack_ca0;
  float fStack_c9c;
  undefined4 uStack_c2c;
  undefined1 local_c18 [16];
  RayK<4> *local_c00;
  ulong local_bf8;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  undefined1 local_bc8 [8];
  float fStack_bc0;
  float fStack_bbc;
  undefined1 (*local_bb0) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_b58;
  vint4 bi_2;
  vint4 bi_4;
  PlueckerHitM<4,_embree::sse42::UVIdentity<4>_> hit;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined1 local_918 [16];
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  uint local_8e8;
  uint uStack_8e4;
  uint uStack_8e0;
  uint uStack_8dc;
  uint local_8d8;
  uint uStack_8d4;
  uint uStack_8d0;
  uint uStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined8 local_888;
  undefined8 uStack_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined8 local_858;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar17 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar18 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar19 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar254 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar205 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar151 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar229 = fVar254 * 0.99999964;
  fVar236 = fVar205 * 0.99999964;
  fVar224 = fVar151 * 0.99999964;
  fVar254 = fVar254 * 1.0000004;
  fVar205 = fVar205 * 1.0000004;
  fVar151 = fVar151 * 1.0000004;
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar20 = (tray->tnear).field_0.i[k];
  auVar184._4_4_ = iVar20;
  auVar184._0_4_ = iVar20;
  auVar184._8_4_ = iVar20;
  auVar184._12_4_ = iVar20;
  iVar21 = (tray->tfar).field_0.i[k];
  auVar169._4_4_ = iVar21;
  auVar169._0_4_ = iVar21;
  auVar169._8_4_ = iVar21;
  auVar169._12_4_ = iVar21;
  local_bb0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar65 = stack + 1;
  local_c00 = ray;
  do {
    pNVar64 = pNVar65;
    if (pNVar64 == stack) break;
    pNVar65 = pNVar64 + -1;
    sVar73 = pNVar64[-1].ptr;
    do {
      if ((sVar73 & 8) == 0) {
        uVar55 = sVar73 & 0xfffffffffffffff0;
        fVar221 = *(float *)(ray + k * 4 + 0x70);
        pfVar14 = (float *)(uVar55 + 0x80 + uVar67);
        pfVar13 = (float *)(uVar55 + 0x20 + uVar67);
        auVar128._0_4_ = ((*pfVar14 * fVar221 + *pfVar13) - fVar17) * fVar229;
        auVar128._4_4_ = ((pfVar14[1] * fVar221 + pfVar13[1]) - fVar17) * fVar229;
        auVar128._8_4_ = ((pfVar14[2] * fVar221 + pfVar13[2]) - fVar17) * fVar229;
        auVar128._12_4_ = ((pfVar14[3] * fVar221 + pfVar13[3]) - fVar17) * fVar229;
        pfVar15 = (float *)(uVar55 + 0x80 + uVar69);
        pfVar13 = (float *)(uVar55 + 0x20 + uVar69);
        pfVar16 = (float *)(uVar55 + 0x80 + uVar71);
        pfVar14 = (float *)(uVar55 + 0x20 + uVar71);
        auVar154._0_4_ = ((*pfVar15 * fVar221 + *pfVar13) - fVar18) * fVar236;
        auVar154._4_4_ = ((pfVar15[1] * fVar221 + pfVar13[1]) - fVar18) * fVar236;
        auVar154._8_4_ = ((pfVar15[2] * fVar221 + pfVar13[2]) - fVar18) * fVar236;
        auVar154._12_4_ = ((pfVar15[3] * fVar221 + pfVar13[3]) - fVar18) * fVar236;
        auVar104._0_4_ = ((*pfVar16 * fVar221 + *pfVar14) - fVar19) * fVar224;
        auVar104._4_4_ = ((pfVar16[1] * fVar221 + pfVar14[1]) - fVar19) * fVar224;
        auVar104._8_4_ = ((pfVar16[2] * fVar221 + pfVar14[2]) - fVar19) * fVar224;
        auVar104._12_4_ = ((pfVar16[3] * fVar221 + pfVar14[3]) - fVar19) * fVar224;
        auVar137 = maxps(auVar154,auVar104);
        auVar104 = maxps(auVar184,auVar128);
        auVar104 = maxps(auVar104,auVar137);
        pfVar15 = (float *)(uVar55 + 0x80 + (uVar67 ^ 0x10));
        pfVar13 = (float *)(uVar55 + 0x20 + (uVar67 ^ 0x10));
        pfVar16 = (float *)(uVar55 + 0x80 + (uVar69 ^ 0x10));
        pfVar14 = (float *)(uVar55 + 0x20 + (uVar69 ^ 0x10));
        auVar171._0_4_ = ((*pfVar15 * fVar221 + *pfVar13) - fVar17) * fVar254;
        auVar171._4_4_ = ((pfVar15[1] * fVar221 + pfVar13[1]) - fVar17) * fVar254;
        auVar171._8_4_ = ((pfVar15[2] * fVar221 + pfVar13[2]) - fVar17) * fVar254;
        auVar171._12_4_ = ((pfVar15[3] * fVar221 + pfVar13[3]) - fVar17) * fVar254;
        auVar188._0_4_ = ((*pfVar16 * fVar221 + *pfVar14) - fVar18) * fVar205;
        auVar188._4_4_ = ((pfVar16[1] * fVar221 + pfVar14[1]) - fVar18) * fVar205;
        auVar188._8_4_ = ((pfVar16[2] * fVar221 + pfVar14[2]) - fVar18) * fVar205;
        auVar188._12_4_ = ((pfVar16[3] * fVar221 + pfVar14[3]) - fVar18) * fVar205;
        pfVar14 = (float *)(uVar55 + 0x80 + (uVar71 ^ 0x10));
        pfVar13 = (float *)(uVar55 + 0x20 + (uVar71 ^ 0x10));
        auVar137._0_4_ = ((*pfVar14 * fVar221 + *pfVar13) - fVar19) * fVar151;
        auVar137._4_4_ = ((pfVar14[1] * fVar221 + pfVar13[1]) - fVar19) * fVar151;
        auVar137._8_4_ = ((pfVar14[2] * fVar221 + pfVar13[2]) - fVar19) * fVar151;
        auVar137._12_4_ = ((pfVar14[3] * fVar221 + pfVar13[3]) - fVar19) * fVar151;
        auVar137 = minps(auVar188,auVar137);
        auVar128 = minps(auVar169,auVar171);
        auVar128 = minps(auVar128,auVar137);
        bVar78 = auVar104._0_4_ <= auVar128._0_4_;
        bVar79 = auVar104._4_4_ <= auVar128._4_4_;
        bVar35 = auVar104._8_4_ <= auVar128._8_4_;
        bVar36 = auVar104._12_4_ <= auVar128._12_4_;
        if (((uint)sVar73 & 7) == 6) {
          bVar78 = (fVar221 < *(float *)(uVar55 + 0xf0) && *(float *)(uVar55 + 0xe0) <= fVar221) &&
                   bVar78;
          bVar79 = (fVar221 < *(float *)(uVar55 + 0xf4) && *(float *)(uVar55 + 0xe4) <= fVar221) &&
                   bVar79;
          bVar35 = (fVar221 < *(float *)(uVar55 + 0xf8) && *(float *)(uVar55 + 0xe8) <= fVar221) &&
                   bVar35;
          bVar36 = (fVar221 < *(float *)(uVar55 + 0xfc) && *(float *)(uVar55 + 0xec) <= fVar221) &&
                   bVar36;
        }
        auVar105._0_4_ = (uint)bVar78 * -0x80000000;
        auVar105._4_4_ = (uint)bVar79 * -0x80000000;
        auVar105._8_4_ = (uint)bVar35 * -0x80000000;
        auVar105._12_4_ = (uint)bVar36 * -0x80000000;
        uVar63 = movmskps((int)unaff_RBX,auVar105);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar63);
      }
      if ((sVar73 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar103 = 4;
        }
        else {
          uVar55 = sVar73 & 0xfffffffffffffff0;
          lVar72 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
            }
          }
          uVar103 = 0;
          sVar73 = *(size_t *)(uVar55 + lVar72 * 8);
          uVar66 = unaff_RBX - 1 & unaff_RBX;
          if (uVar66 != 0) {
            pNVar65->ptr = sVar73;
            lVar72 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
              }
            }
            uVar74 = uVar66 - 1;
            while( true ) {
              pNVar65 = pNVar65 + 1;
              sVar73 = *(size_t *)(uVar55 + lVar72 * 8);
              uVar74 = uVar74 & uVar66;
              if (uVar74 == 0) break;
              pNVar65->ptr = sVar73;
              lVar72 = 0;
              if (uVar74 != 0) {
                for (; (uVar74 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                }
              }
              uVar66 = uVar74 - 1;
            }
          }
        }
      }
      else {
        uVar103 = 6;
      }
    } while (uVar103 == 0);
    if (uVar103 == 6) {
      uVar55 = (ulong)((uint)sVar73 & 0xf);
      uVar66 = uVar55 - 8;
      bVar78 = uVar55 != 8;
      if (bVar78) {
        uVar74 = sVar73 & 0xfffffffffffffff0;
        uVar55 = 0;
        do {
          lVar72 = uVar55 * 0x90;
          fVar126 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar74 + 0x80 + lVar72)) *
                    *(float *)(uVar74 + 0x84 + lVar72);
          uVar61 = *(ulong *)(uVar74 + 0x20 + lVar72);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar61;
          uVar58 = *(ulong *)(uVar74 + 0x24 + lVar72);
          auVar138._8_8_ = 0;
          auVar138._0_8_ = uVar58;
          bVar37 = (byte)uVar58;
          bVar80 = (byte)uVar61;
          bVar38 = (byte)(uVar58 >> 8);
          bVar96 = (byte)(uVar61 >> 8);
          bVar39 = (byte)(uVar58 >> 0x10);
          bVar97 = (byte)(uVar61 >> 0x10);
          bVar40 = (byte)(uVar58 >> 0x18);
          bVar98 = (byte)(uVar61 >> 0x18);
          bVar41 = (byte)(uVar58 >> 0x20);
          bVar99 = (byte)(uVar61 >> 0x20);
          bVar42 = (byte)(uVar58 >> 0x28);
          bVar100 = (byte)(uVar61 >> 0x28);
          bVar43 = (byte)(uVar58 >> 0x30);
          bVar101 = (byte)(uVar61 >> 0x30);
          bVar52 = (byte)(uVar61 >> 0x38);
          bVar44 = (byte)(uVar58 >> 0x38);
          auVar81[0] = -((byte)((bVar37 < bVar80) * bVar37 | (bVar37 >= bVar80) * bVar80) == bVar80)
          ;
          auVar81[1] = -((byte)((bVar38 < bVar96) * bVar38 | (bVar38 >= bVar96) * bVar96) == bVar96)
          ;
          auVar81[2] = -((byte)((bVar39 < bVar97) * bVar39 | (bVar39 >= bVar97) * bVar97) == bVar97)
          ;
          auVar81[3] = -((byte)((bVar40 < bVar98) * bVar40 | (bVar40 >= bVar98) * bVar98) == bVar98)
          ;
          auVar81[4] = -((byte)((bVar41 < bVar99) * bVar41 | (bVar41 >= bVar99) * bVar99) == bVar99)
          ;
          auVar81[5] = -((byte)((bVar42 < bVar100) * bVar42 | (bVar42 >= bVar100) * bVar100) ==
                        bVar100);
          auVar81[6] = -((byte)((bVar43 < bVar101) * bVar43 | (bVar43 >= bVar101) * bVar101) ==
                        bVar101);
          auVar81[7] = -((byte)((bVar44 < bVar52) * bVar44 | (bVar44 >= bVar52) * bVar52) == bVar52)
          ;
          auVar81[8] = 0xff;
          auVar81[9] = 0xff;
          auVar81[10] = 0xff;
          auVar81[0xb] = 0xff;
          auVar81[0xc] = 0xff;
          auVar81[0xd] = 0xff;
          auVar81[0xe] = 0xff;
          auVar81[0xf] = 0xff;
          auVar104 = pmovzxbd(auVar106,auVar106);
          fVar221 = *(float *)(uVar74 + 0x38 + lVar72);
          fVar201 = *(float *)(uVar74 + 0x3c + lVar72);
          fVar223 = *(float *)(uVar74 + 0x40 + lVar72);
          fVar102 = *(float *)(uVar74 + 0x44 + lVar72);
          fVar206 = (float)auVar104._0_4_ * fVar102 + fVar221;
          fVar212 = (float)auVar104._4_4_ * fVar102 + fVar221;
          fVar216 = (float)auVar104._8_4_ * fVar102 + fVar221;
          fVar220 = (float)auVar104._12_4_ * fVar102 + fVar221;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)(uVar74 + 0x50 + lVar72);
          auVar104 = pmovzxbd(auVar107,auVar107);
          fVar167 = *(float *)(uVar74 + 0x74 + lVar72);
          fVar176 = *(float *)(uVar74 + 0x68 + lVar72);
          auVar128 = pmovzxbd(auVar138,auVar138);
          fVar207 = (float)auVar128._0_4_ * fVar102 + fVar221;
          fVar213 = (float)auVar128._4_4_ * fVar102 + fVar221;
          fVar217 = (float)auVar128._8_4_ * fVar102 + fVar221;
          fVar221 = (float)auVar128._12_4_ * fVar102 + fVar221;
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)(uVar74 + 0x54 + lVar72);
          auVar128 = pmovzxbd(auVar139,auVar139);
          auVar152._8_8_ = 0;
          auVar152._0_8_ = *(ulong *)(uVar74 + 0x28 + lVar72);
          auVar137 = pmovzxbd(auVar152,auVar152);
          fVar102 = *(float *)(uVar74 + 0x48 + lVar72);
          fVar180 = (float)auVar137._0_4_ * fVar102 + fVar201;
          fVar191 = (float)auVar137._4_4_ * fVar102 + fVar201;
          fVar195 = (float)auVar137._8_4_ * fVar102 + fVar201;
          fVar200 = (float)auVar137._12_4_ * fVar102 + fVar201;
          auVar153._8_8_ = 0;
          auVar153._0_8_ = *(ulong *)(uVar74 + 0x58 + lVar72);
          auVar154 = pmovzxbd(auVar153,auVar153);
          fVar197 = *(float *)(uVar74 + 0x78 + lVar72);
          fVar202 = *(float *)(uVar74 + 0x6c + lVar72);
          auVar185._8_8_ = 0;
          auVar185._0_8_ = *(ulong *)(uVar74 + 0x2c + lVar72);
          auVar137 = pmovzxbd(auVar185,auVar185);
          fVar181 = (float)auVar137._0_4_ * fVar102 + fVar201;
          fVar192 = (float)auVar137._4_4_ * fVar102 + fVar201;
          fVar196 = (float)auVar137._8_4_ * fVar102 + fVar201;
          fVar201 = (float)auVar137._12_4_ * fVar102 + fVar201;
          auVar170._8_8_ = 0;
          auVar170._0_8_ = *(ulong *)(uVar74 + 0x5c + lVar72);
          auVar171 = pmovzxbd(auVar170,auVar170);
          auVar186._8_8_ = 0;
          auVar186._0_8_ = *(ulong *)(uVar74 + 0x30 + lVar72);
          auVar137 = pmovzxbd(auVar186,auVar186);
          fVar102 = *(float *)(uVar74 + 0x4c + lVar72);
          fVar208 = (float)auVar137._0_4_ * fVar102 + fVar223;
          fVar214 = (float)auVar137._4_4_ * fVar102 + fVar223;
          fVar218 = (float)auVar137._8_4_ * fVar102 + fVar223;
          fVar222 = (float)auVar137._12_4_ * fVar102 + fVar223;
          auVar187._8_8_ = 0;
          auVar187._0_8_ = *(ulong *)(uVar74 + 0x60 + lVar72);
          auVar188 = pmovzxbd(auVar187,auVar187);
          fVar122 = *(float *)(uVar74 + 0x7c + lVar72);
          fVar124 = *(float *)(uVar74 + 0x70 + lVar72);
          auVar210._8_8_ = 0;
          auVar210._0_8_ = *(ulong *)(uVar74 + 0x34 + lVar72);
          auVar137 = pmovzxbd(auVar210,auVar210);
          fVar209 = (float)auVar137._0_4_ * fVar102 + fVar223;
          fVar215 = (float)auVar137._4_4_ * fVar102 + fVar223;
          fVar219 = (float)auVar137._8_4_ * fVar102 + fVar223;
          fVar223 = (float)auVar137._12_4_ * fVar102 + fVar223;
          auVar144._8_8_ = 0;
          auVar144._0_8_ = *(ulong *)(uVar74 + 100 + lVar72);
          auVar137 = pmovzxbd(auVar144,auVar144);
          fVar102 = (((((float)auVar104._0_4_ * fVar167 + fVar176) - fVar206) * fVar126 + fVar206) -
                    fVar17) * fVar229;
          fVar206 = (((((float)auVar104._4_4_ * fVar167 + fVar176) - fVar212) * fVar126 + fVar212) -
                    fVar17) * fVar229;
          fVar212 = (((((float)auVar104._8_4_ * fVar167 + fVar176) - fVar216) * fVar126 + fVar216) -
                    fVar17) * fVar229;
          fVar216 = (((((float)auVar104._12_4_ * fVar167 + fVar176) - fVar220) * fVar126 + fVar220)
                    - fVar17) * fVar229;
          fVar220 = (((((float)auVar154._0_4_ * fVar197 + fVar202) - fVar180) * fVar126 + fVar180) -
                    fVar18) * fVar236;
          fVar160 = (((((float)auVar154._4_4_ * fVar197 + fVar202) - fVar191) * fVar126 + fVar191) -
                    fVar18) * fVar236;
          fVar162 = (((((float)auVar154._8_4_ * fVar197 + fVar202) - fVar195) * fVar126 + fVar195) -
                    fVar18) * fVar236;
          fVar200 = (((((float)auVar154._12_4_ * fVar197 + fVar202) - fVar200) * fVar126 + fVar200)
                    - fVar18) * fVar236;
          fVar180 = (((((float)auVar128._0_4_ * fVar167 + fVar176) - fVar207) * fVar126 + fVar207) -
                    fVar17) * fVar254;
          fVar191 = (((((float)auVar128._4_4_ * fVar167 + fVar176) - fVar213) * fVar126 + fVar213) -
                    fVar17) * fVar254;
          fVar195 = (((((float)auVar128._8_4_ * fVar167 + fVar176) - fVar217) * fVar126 + fVar217) -
                    fVar17) * fVar254;
          fVar221 = (((((float)auVar128._12_4_ * fVar167 + fVar176) - fVar221) * fVar126 + fVar221)
                    - fVar17) * fVar254;
          fVar167 = (((((float)auVar171._0_4_ * fVar197 + fVar202) - fVar181) * fVar126 + fVar181) -
                    fVar18) * fVar205;
          fVar176 = (((((float)auVar171._4_4_ * fVar197 + fVar202) - fVar192) * fVar126 + fVar192) -
                    fVar18) * fVar205;
          fVar181 = (((((float)auVar171._8_4_ * fVar197 + fVar202) - fVar196) * fVar126 + fVar196) -
                    fVar18) * fVar205;
          fVar201 = (((((float)auVar171._12_4_ * fVar197 + fVar202) - fVar201) * fVar126 + fVar201)
                    - fVar18) * fVar205;
          uVar127 = (uint)((int)fVar180 < (int)fVar102) * (int)fVar180 |
                    (uint)((int)fVar180 >= (int)fVar102) * (int)fVar102;
          uVar133 = (uint)((int)fVar191 < (int)fVar206) * (int)fVar191 |
                    (uint)((int)fVar191 >= (int)fVar206) * (int)fVar206;
          uVar134 = (uint)((int)fVar195 < (int)fVar212) * (int)fVar195 |
                    (uint)((int)fVar195 >= (int)fVar212) * (int)fVar212;
          uVar135 = (uint)((int)fVar221 < (int)fVar216) * (int)fVar221 |
                    (uint)((int)fVar221 >= (int)fVar216) * (int)fVar216;
          uVar136 = (uint)((int)fVar180 < (int)fVar102) * (int)fVar102 |
                    (uint)((int)fVar180 >= (int)fVar102) * (int)fVar180;
          uVar141 = (uint)((int)fVar191 < (int)fVar206) * (int)fVar206 |
                    (uint)((int)fVar191 >= (int)fVar206) * (int)fVar191;
          uVar142 = (uint)((int)fVar195 < (int)fVar212) * (int)fVar212 |
                    (uint)((int)fVar195 >= (int)fVar212) * (int)fVar195;
          uVar143 = (uint)((int)fVar221 < (int)fVar216) * (int)fVar216 |
                    (uint)((int)fVar221 >= (int)fVar216) * (int)fVar221;
          uVar103 = (uint)((int)fVar167 < (int)fVar220) * (int)fVar167 |
                    (uint)((int)fVar167 >= (int)fVar220) * (int)fVar220;
          uVar121 = (uint)((int)fVar176 < (int)fVar160) * (int)fVar176 |
                    (uint)((int)fVar176 >= (int)fVar160) * (int)fVar160;
          uVar123 = (uint)((int)fVar181 < (int)fVar162) * (int)fVar181 |
                    (uint)((int)fVar181 >= (int)fVar162) * (int)fVar162;
          uVar125 = (uint)((int)fVar201 < (int)fVar200) * (int)fVar201 |
                    (uint)((int)fVar201 >= (int)fVar200) * (int)fVar200;
          uVar103 = ((int)uVar103 < (int)uVar127) * uVar127 |
                    ((int)uVar103 >= (int)uVar127) * uVar103;
          uVar121 = ((int)uVar121 < (int)uVar133) * uVar133 |
                    ((int)uVar121 >= (int)uVar133) * uVar121;
          uVar123 = ((int)uVar123 < (int)uVar134) * uVar134 |
                    ((int)uVar123 >= (int)uVar134) * uVar123;
          uVar125 = ((int)uVar125 < (int)uVar135) * uVar135 |
                    ((int)uVar125 >= (int)uVar135) * uVar125;
          uVar127 = (uint)((int)fVar167 < (int)fVar220) * (int)fVar220 |
                    (uint)((int)fVar167 >= (int)fVar220) * (int)fVar167;
          uVar133 = (uint)((int)fVar176 < (int)fVar160) * (int)fVar160 |
                    (uint)((int)fVar176 >= (int)fVar160) * (int)fVar176;
          uVar134 = (uint)((int)fVar181 < (int)fVar162) * (int)fVar162 |
                    (uint)((int)fVar181 >= (int)fVar162) * (int)fVar181;
          uVar135 = (uint)((int)fVar201 < (int)fVar200) * (int)fVar200 |
                    (uint)((int)fVar201 >= (int)fVar200) * (int)fVar201;
          fVar167 = (((((float)auVar188._0_4_ * fVar122 + fVar124) - fVar208) * fVar126 + fVar208) -
                    fVar19) * fVar224;
          fVar176 = (((((float)auVar188._4_4_ * fVar122 + fVar124) - fVar214) * fVar126 + fVar214) -
                    fVar19) * fVar224;
          fVar197 = (((((float)auVar188._8_4_ * fVar122 + fVar124) - fVar218) * fVar126 + fVar218) -
                    fVar19) * fVar224;
          fVar202 = (((((float)auVar188._12_4_ * fVar122 + fVar124) - fVar222) * fVar126 + fVar222)
                    - fVar19) * fVar224;
          fVar221 = (((((float)auVar137._0_4_ * fVar122 + fVar124) - fVar209) * fVar126 + fVar209) -
                    fVar19) * fVar151;
          fVar201 = (((((float)auVar137._4_4_ * fVar122 + fVar124) - fVar215) * fVar126 + fVar215) -
                    fVar19) * fVar151;
          fVar102 = (((((float)auVar137._8_4_ * fVar122 + fVar124) - fVar219) * fVar126 + fVar219) -
                    fVar19) * fVar151;
          fVar223 = (((((float)auVar137._12_4_ * fVar122 + fVar124) - fVar223) * fVar126 + fVar223)
                    - fVar19) * fVar151;
          uVar168 = ((int)uVar136 < (int)uVar127) * uVar136 |
                    ((int)uVar136 >= (int)uVar127) * uVar127;
          uVar177 = ((int)uVar141 < (int)uVar133) * uVar141 |
                    ((int)uVar141 >= (int)uVar133) * uVar133;
          uVar178 = ((int)uVar142 < (int)uVar134) * uVar142 |
                    ((int)uVar142 >= (int)uVar134) * uVar134;
          uVar179 = ((int)uVar143 < (int)uVar135) * uVar143 |
                    ((int)uVar143 >= (int)uVar135) * uVar135;
          uVar127 = (uint)((int)fVar221 < (int)fVar167) * (int)fVar221 |
                    (uint)((int)fVar221 >= (int)fVar167) * (int)fVar167;
          uVar133 = (uint)((int)fVar201 < (int)fVar176) * (int)fVar201 |
                    (uint)((int)fVar201 >= (int)fVar176) * (int)fVar176;
          uVar134 = (uint)((int)fVar102 < (int)fVar197) * (int)fVar102 |
                    (uint)((int)fVar102 >= (int)fVar197) * (int)fVar197;
          uVar135 = (uint)((int)fVar223 < (int)fVar202) * (int)fVar223 |
                    (uint)((int)fVar223 >= (int)fVar202) * (int)fVar202;
          uVar136 = (uint)((int)fVar221 < (int)fVar167) * (int)fVar167 |
                    (uint)((int)fVar221 >= (int)fVar167) * (int)fVar221;
          uVar141 = (uint)((int)fVar201 < (int)fVar176) * (int)fVar176 |
                    (uint)((int)fVar201 >= (int)fVar176) * (int)fVar201;
          uVar142 = (uint)((int)fVar102 < (int)fVar197) * (int)fVar197 |
                    (uint)((int)fVar102 >= (int)fVar197) * (int)fVar102;
          uVar143 = (uint)((int)fVar223 < (int)fVar202) * (int)fVar202 |
                    (uint)((int)fVar223 >= (int)fVar202) * (int)fVar223;
          uVar127 = (uint)((int)uVar127 < iVar20) * iVar20 | ((int)uVar127 >= iVar20) * uVar127;
          uVar133 = (uint)((int)uVar133 < iVar20) * iVar20 | ((int)uVar133 >= iVar20) * uVar133;
          uVar134 = (uint)((int)uVar134 < iVar20) * iVar20 | ((int)uVar134 >= iVar20) * uVar134;
          uVar135 = (uint)((int)uVar135 < iVar20) * iVar20 | ((int)uVar135 >= iVar20) * uVar135;
          uVar136 = (uint)(iVar21 < (int)uVar136) * iVar21 | (iVar21 >= (int)uVar136) * uVar136;
          uVar141 = (uint)(iVar21 < (int)uVar141) * iVar21 | (iVar21 >= (int)uVar141) * uVar141;
          uVar142 = (uint)(iVar21 < (int)uVar142) * iVar21 | (iVar21 >= (int)uVar142) * uVar142;
          uVar143 = (uint)(iVar21 < (int)uVar143) * iVar21 | (iVar21 >= (int)uVar143) * uVar143;
          auVar129._0_4_ =
               -(uint)((int)(((int)uVar168 < (int)uVar136) * uVar168 |
                            ((int)uVar168 >= (int)uVar136) * uVar136) <
                      (int)(((int)uVar127 < (int)uVar103) * uVar103 |
                           ((int)uVar127 >= (int)uVar103) * uVar127));
          auVar129._4_4_ =
               -(uint)((int)(((int)uVar177 < (int)uVar141) * uVar177 |
                            ((int)uVar177 >= (int)uVar141) * uVar141) <
                      (int)(((int)uVar133 < (int)uVar121) * uVar121 |
                           ((int)uVar133 >= (int)uVar121) * uVar133));
          auVar129._8_4_ =
               -(uint)((int)(((int)uVar178 < (int)uVar142) * uVar178 |
                            ((int)uVar178 >= (int)uVar142) * uVar142) <
                      (int)(((int)uVar134 < (int)uVar123) * uVar123 |
                           ((int)uVar134 >= (int)uVar123) * uVar134));
          auVar129._12_4_ =
               -(uint)((int)(((int)uVar179 < (int)uVar143) * uVar179 |
                            ((int)uVar179 >= (int)uVar143) * uVar143) <
                      (int)(((int)uVar135 < (int)uVar125) * uVar125 |
                           ((int)uVar135 >= (int)uVar125) * uVar135));
          auVar104 = pmovsxbd(auVar81,auVar81);
          uVar103 = movmskps((int)uVar55,~auVar129 & auVar104);
          if (uVar103 != 0) {
            lVar72 = lVar72 + uVar74;
            uVar61 = (ulong)(uVar103 & 0xff);
            pRVar75 = ray;
            do {
              ray = local_c00;
              lVar34 = 0;
              if (uVar61 != 0) {
                for (; (uVar61 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
              uVar24 = *(ushort *)(lVar72 + lVar34 * 8);
              uVar25 = *(ushort *)(lVar72 + 2 + lVar34 * 8);
              uVar103 = *(uint *)(lVar72 + 0x88);
              local_bf8 = (ulong)uVar103;
              uVar121 = *(uint *)(lVar72 + 4 + lVar34 * 8);
              pGVar26 = (context->scene->geometries).items[local_bf8].ptr;
              lVar59 = (ulong)uVar121 *
                       pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
              lVar27 = *(long *)&pGVar26->field_0x58;
              fVar221 = pGVar26->fnumTimeSegments;
              fVar201 = (pGVar26->time_range).lower;
              auVar130._0_4_ = (pGVar26->time_range).upper - fVar201;
              auVar108._4_4_ = fVar201;
              auVar108._0_4_ = fVar201;
              auVar108._8_4_ = fVar201;
              auVar108._12_4_ = fVar201;
              auVar145._0_4_ = *(float *)(pRVar75 + 0x70) - fVar201;
              auVar145._4_4_ = *(float *)(pRVar75 + 0x74) - fVar201;
              auVar145._8_4_ = *(float *)(pRVar75 + 0x78) - fVar201;
              auVar145._12_4_ = *(float *)(pRVar75 + 0x7c) - fVar201;
              auVar130._4_4_ = auVar130._0_4_;
              auVar130._8_4_ = auVar130._0_4_;
              auVar130._12_4_ = auVar130._0_4_;
              auVar104 = divps(auVar145,auVar130);
              auVar146._0_4_ = auVar104._0_4_ * fVar221;
              auVar146._4_4_ = auVar104._4_4_ * fVar221;
              auVar146._8_4_ = auVar104._8_4_ * fVar221;
              auVar146._12_4_ = auVar104._12_4_ * fVar221;
              auVar104 = roundps(auVar108,auVar146,1);
              auVar82._0_4_ = fVar221 + -1.0;
              auVar82._4_4_ = auVar82._0_4_;
              auVar82._8_4_ = auVar82._0_4_;
              auVar82._12_4_ = auVar82._0_4_;
              auVar104 = minps(auVar104,auVar82);
              auVar104 = maxps(auVar104,_DAT_01feba10);
              ftime.field_0.v[0] = auVar146._0_4_ - auVar104._0_4_;
              ftime.field_0.v[1] = auVar146._4_4_ - auVar104._4_4_;
              ftime.field_0.v[2] = auVar146._8_4_ - auVar104._8_4_;
              ftime.field_0.v[3] = auVar146._12_4_ - auVar104._12_4_;
              itime.field_0.i[0] = (int)auVar104._0_4_;
              itime.field_0.i[1] = (int)auVar104._4_4_;
              itime.field_0.i[2] = (int)auVar104._8_4_;
              itime.field_0.i[3] = (int)auVar104._12_4_;
              uVar125 = uVar24 & 0x7fff;
              uVar127 = uVar25 & 0x7fff;
              uVar123 = *(uint *)(lVar27 + 4 + lVar59);
              uVar68 = (ulong)uVar123;
              uVar60 = (ulong)(uVar123 * uVar127 + *(int *)(lVar27 + lVar59) + uVar125);
              lVar28 = *(long *)&pGVar26[2].numPrimitives;
              lVar70 = (long)itime.field_0.i[k] * 0x38;
              lVar29 = *(long *)(lVar28 + 0x10 + lVar70);
              lVar30 = *(long *)(lVar28 + lVar70);
              pfVar13 = (float *)(lVar30 + lVar29 * uVar60);
              lVar31 = *(long *)(lVar28 + 0x48 + lVar70);
              pfVar14 = (float *)(lVar30 + (uVar60 + 1) * lVar29);
              lVar34 = uVar60 + uVar68;
              pfVar15 = (float *)(lVar30 + lVar34 * lVar29);
              lVar76 = uVar60 + uVar68 + 1;
              pfVar16 = (float *)(lVar30 + lVar76 * lVar29);
              uVar58 = (ulong)(-1 < (short)uVar24);
              lVar62 = uVar60 + uVar58 + 1;
              pfVar1 = (float *)(lVar30 + lVar62 * lVar29);
              lVar77 = uVar58 + lVar76;
              pfVar2 = (float *)(lVar30 + lVar77 * lVar29);
              uVar58 = 0;
              if (-1 < (short)uVar25) {
                uVar58 = uVar68;
              }
              pfVar3 = (float *)(lVar30 + (lVar34 + uVar58) * lVar29);
              pfVar4 = (float *)(lVar30 + (lVar76 + uVar58) * lVar29);
              puVar5 = (undefined8 *)(lVar30 + lVar29 * (uVar58 + lVar77));
              local_888 = *puVar5;
              uStack_880 = puVar5[1];
              lVar28 = *(long *)(lVar28 + 0x38 + lVar70);
              pfVar6 = (float *)(lVar28 + lVar31 * uVar60);
              pfVar7 = (float *)(lVar28 + lVar31 * (uVar60 + 1));
              pfVar8 = (float *)(lVar28 + lVar31 * lVar34);
              pfVar9 = (float *)(lVar28 + lVar31 * lVar76);
              pfVar10 = (float *)(lVar28 + lVar31 * lVar62);
              pfVar11 = (float *)(lVar28 + lVar31 * lVar77);
              local_898 = *(float *)((long)&stack[-2].ptr + k * 4);
              pfVar12 = (float *)(lVar28 + lVar31 * (lVar34 + uVar58));
              fVar126 = (*pfVar7 - *pfVar14) * local_898 + *pfVar14;
              local_868 = (pfVar7[1] - pfVar14[1]) * local_898 + pfVar14[1];
              local_848 = (pfVar7[2] - pfVar14[2]) * local_898 + pfVar14[2];
              pfVar14 = (float *)(lVar28 + lVar31 * (lVar76 + uVar58));
              local_bd8 = (*pfVar8 - *pfVar15) * local_898 + *pfVar15;
              local_bc8._0_4_ = (pfVar8[1] - pfVar15[1]) * local_898 + pfVar15[1];
              fVar191 = (pfVar8[2] - pfVar15[2]) * local_898 + pfVar15[2];
              puVar5 = (undefined8 *)(lVar28 + (uVar58 + lVar77) * lVar31);
              local_8b8 = *puVar5;
              uStack_8b0 = puVar5[1];
              fVar230 = (*pfVar9 - *pfVar16) * local_898 + *pfVar16;
              fVar232 = (pfVar9[1] - pfVar16[1]) * local_898 + pfVar16[1];
              fVar160 = (pfVar9[2] - pfVar16[2]) * local_898 + pfVar16[2];
              fVar195 = (*pfVar10 - *pfVar1) * local_898 + *pfVar1;
              fStack_864 = (pfVar10[1] - pfVar1[1]) * local_898 + pfVar1[1];
              local_878 = (*pfVar11 - *pfVar2) * local_898 + *pfVar2;
              fStack_874 = (pfVar11[1] - pfVar2[1]) * local_898 + pfVar2[1];
              fStack_870 = (pfVar11[2] - pfVar2[2]) * local_898 + pfVar2[2];
              fStack_bbc = (pfVar12[1] - pfVar3[1]) * local_898 + pfVar3[1];
              fVar197 = (pfVar12[2] - pfVar3[2]) * local_898 + pfVar3[2];
              fStack_894 = local_898;
              fStack_890 = local_898;
              fStack_88c = local_898;
              local_8a8 = (*pfVar14 - *pfVar4) * local_898 + *pfVar4;
              fStack_8a4 = (pfVar14[1] - pfVar4[1]) * local_898 + pfVar4[1];
              fStack_8a0 = (pfVar14[2] - pfVar4[2]) * local_898 + pfVar4[2];
              fStack_86c = (pfVar11[3] - pfVar2[3]) * local_898 + pfVar2[3];
              fStack_89c = (pfVar14[3] - pfVar4[3]) * local_898 + pfVar4[3];
              fVar221 = *(float *)(local_c00 + k * 4);
              fVar182 = ((*pfVar6 - *pfVar13) * local_898 + *pfVar13) - fVar221;
              fVar193 = fVar126 - fVar221;
              fVar198 = fVar230 - fVar221;
              fVar203 = local_bd8 - fVar221;
              local_858 = CONCAT44(fVar195,fVar126);
              fVar126 = fVar126 - fVar221;
              fVar195 = fVar195 - fVar221;
              fVar162 = local_878 - fVar221;
              fVar181 = fVar230 - fVar221;
              fVar255 = local_bd8 - fVar221;
              fVar258 = fVar230 - fVar221;
              fVar260 = local_8a8 - fVar221;
              fVar221 = ((*pfVar12 - *pfVar3) * local_898 + *pfVar3) - fVar221;
              fVar201 = *(float *)(local_c00 + k * 4 + 0x10);
              fVar225 = ((pfVar6[1] - pfVar13[1]) * local_898 + pfVar13[1]) - fVar201;
              fVar226 = local_868 - fVar201;
              fVar227 = fVar232 - fVar201;
              fVar228 = (float)local_bc8._0_4_ - fVar201;
              fStack_860 = fStack_874;
              fStack_85c = fVar232;
              fVar180 = local_868 - fVar201;
              fVar220 = fStack_864 - fVar201;
              fVar200 = fStack_874 - fVar201;
              fVar192 = fVar232 - fVar201;
              local_bc8._4_4_ = fVar232;
              fStack_bc0 = fStack_8a4;
              fVar202 = (float)local_bc8._0_4_ - fVar201;
              fVar122 = fVar232 - fVar201;
              fVar124 = fStack_8a4 - fVar201;
              fVar201 = fStack_bbc - fVar201;
              fVar223 = *(float *)(local_c00 + k * 4 + 0x20);
              fVar196 = ((pfVar6[2] - pfVar13[2]) * local_898 + pfVar13[2]) - fVar223;
              fVar208 = local_848 - fVar223;
              fVar213 = fVar160 - fVar223;
              fVar215 = fVar191 - fVar223;
              fStack_844 = (pfVar10[2] - pfVar1[2]) * local_898 + pfVar1[2];
              fStack_840 = fStack_870;
              fStack_83c = fVar160;
              fVar250 = fStack_870 - fVar223;
              fVar252 = fVar160 - fVar223;
              fVar206 = fVar191 - fVar223;
              fVar212 = fVar160 - fVar223;
              fVar216 = fStack_8a0 - fVar223;
              fVar223 = fVar197 - fVar223;
              fVar218 = fVar255 - fVar182;
              fVar222 = fVar258 - fVar193;
              fVar163 = fVar260 - fVar198;
              fVar165 = fVar221 - fVar203;
              local_818 = fVar202 - fVar225;
              fStack_814 = fVar122 - fVar226;
              fStack_810 = fVar124 - fVar227;
              fStack_80c = fVar201 - fVar228;
              local_808 = fVar206 - fVar196;
              fStack_804 = fVar212 - fVar208;
              fStack_800 = fVar216 - fVar213;
              fStack_7fc = fVar223 - fVar215;
              fVar102 = *(float *)(local_c00 + k * 4 + 0x50);
              fVar167 = *(float *)(local_c00 + k * 4 + 0x60);
              fVar176 = *(float *)(local_c00 + k * 4 + 0x40);
              fVar231 = (local_818 * (fVar206 + fVar196) - (fVar202 + fVar225) * local_808) *
                        fVar176 + ((fVar255 + fVar182) * local_808 - (fVar206 + fVar196) * fVar218)
                                  * fVar102 +
                                  (fVar218 * (fVar202 + fVar225) - (fVar255 + fVar182) * local_818)
                                  * fVar167;
              fVar233 = (fStack_814 * (fVar212 + fVar208) - (fVar122 + fVar226) * fStack_804) *
                        fVar176 + ((fVar258 + fVar193) * fStack_804 - (fVar212 + fVar208) * fVar222)
                                  * fVar102 +
                                  (fVar222 * (fVar122 + fVar226) - (fVar258 + fVar193) * fStack_814)
                                  * fVar167;
              fVar234 = (fStack_810 * (fVar216 + fVar213) - (fVar124 + fVar227) * fStack_800) *
                        fVar176 + ((fVar260 + fVar198) * fStack_800 - (fVar216 + fVar213) * fVar163)
                                  * fVar102 +
                                  (fVar163 * (fVar124 + fVar227) - (fVar260 + fVar198) * fStack_810)
                                  * fVar167;
              fVar235 = (fStack_80c * (fVar223 + fVar215) - (fVar201 + fVar228) * fStack_7fc) *
                        fVar176 + ((fVar221 + fVar203) * fStack_7fc - (fVar223 + fVar215) * fVar165)
                                  * fVar102 +
                                  (fVar165 * (fVar201 + fVar228) - (fVar221 + fVar203) * fStack_80c)
                                  * fVar167;
              fVar219 = fVar182 - fVar126;
              fVar161 = fVar193 - fVar195;
              fVar164 = fVar198 - fVar162;
              fVar166 = fVar203 - fVar181;
              fVar248 = fVar225 - fVar180;
              fVar249 = fVar226 - fVar220;
              fVar251 = fVar227 - fVar200;
              fVar253 = fVar228 - fVar192;
              local_828 = fVar196 - fStack_8a0;
              fStack_824 = fVar208 - fVar197;
              fStack_820 = fVar213 - fVar250;
              fStack_81c = fVar215 - fVar252;
              local_838 = (fVar248 * (fVar196 + fStack_8a0) - (fVar225 + fVar180) * local_828) *
                          fVar176 + ((fVar182 + fVar126) * local_828 -
                                    (fVar196 + fStack_8a0) * fVar219) * fVar102 +
                                    (fVar219 * (fVar225 + fVar180) - (fVar182 + fVar126) * fVar248)
                                    * fVar167;
              fStack_834 = (fVar249 * (fVar208 + fVar197) - (fVar226 + fVar220) * fStack_824) *
                           fVar176 + ((fVar193 + fVar195) * fStack_824 -
                                     (fVar208 + fVar197) * fVar161) * fVar102 +
                                     (fVar161 * (fVar226 + fVar220) - (fVar193 + fVar195) * fVar249)
                                     * fVar167;
              fStack_830 = (fVar251 * (fVar213 + fVar250) - (fVar227 + fVar200) * fStack_820) *
                           fVar176 + ((fVar198 + fVar162) * fStack_820 -
                                     (fVar213 + fVar250) * fVar164) * fVar102 +
                                     (fVar164 * (fVar227 + fVar200) - (fVar198 + fVar162) * fVar251)
                                     * fVar167;
              fStack_82c = (fVar253 * (fVar215 + fVar252) - (fVar228 + fVar192) * fStack_81c) *
                           fVar176 + ((fVar203 + fVar181) * fStack_81c -
                                     (fVar215 + fVar252) * fVar166) * fVar102 +
                                     (fVar166 * (fVar228 + fVar192) - (fVar203 + fVar181) * fVar253)
                                     * fVar167;
              fVar239 = fVar126 - fVar255;
              fVar242 = fVar195 - fVar258;
              fVar243 = fVar162 - fVar260;
              fVar244 = fVar181 - fVar221;
              fVar183 = fVar180 - fVar202;
              fVar194 = fVar220 - fVar122;
              fVar199 = fVar200 - fVar124;
              fVar204 = fVar192 - fVar201;
              fVar207 = fStack_8a0 - fVar206;
              fVar209 = fVar197 - fVar212;
              fVar214 = fVar250 - fVar216;
              fVar217 = fVar252 - fVar223;
              fVar202 = (fVar183 * (fVar206 + fStack_8a0) - (fVar202 + fVar180) * fVar207) * fVar176
                        + ((fVar255 + fVar126) * fVar207 - (fVar206 + fStack_8a0) * fVar239) *
                          fVar102 + (fVar239 * (fVar202 + fVar180) - (fVar255 + fVar126) * fVar183)
                                    * fVar167;
              fVar122 = (fVar194 * (fVar212 + fVar197) - (fVar122 + fVar220) * fVar209) * fVar176 +
                        ((fVar258 + fVar195) * fVar209 - (fVar212 + fVar197) * fVar242) * fVar102 +
                        (fVar242 * (fVar122 + fVar220) - (fVar258 + fVar195) * fVar194) * fVar167;
              fVar124 = (fVar199 * (fVar216 + fVar250) - (fVar124 + fVar200) * fVar214) * fVar176 +
                        ((fVar260 + fVar162) * fVar214 - (fVar216 + fVar250) * fVar243) * fVar102 +
                        (fVar243 * (fVar124 + fVar200) - (fVar260 + fVar162) * fVar199) * fVar167;
              fVar206 = (fVar204 * (fVar223 + fVar252) - (fVar201 + fVar192) * fVar217) * fVar176 +
                        ((fVar221 + fVar181) * fVar217 - (fVar223 + fVar252) * fVar244) * fVar102 +
                        (fVar244 * (fVar201 + fVar192) - (fVar221 + fVar181) * fVar204) * fVar167;
              fVar221 = fVar231 + local_838 + fVar202;
              fVar201 = fVar233 + fStack_834 + fVar122;
              fVar223 = fVar234 + fStack_830 + fVar124;
              fVar197 = fVar235 + fStack_82c + fVar206;
              auVar83._4_4_ = fVar233;
              auVar83._0_4_ = fVar231;
              auVar83._8_4_ = fVar234;
              auVar83._12_4_ = fVar235;
              auVar45._4_4_ = fStack_834;
              auVar45._0_4_ = local_838;
              auVar45._8_4_ = fStack_830;
              auVar45._12_4_ = fStack_82c;
              auVar104 = minps(auVar83,auVar45);
              auVar50._4_4_ = fVar122;
              auVar50._0_4_ = fVar202;
              auVar50._8_4_ = fVar124;
              auVar50._12_4_ = fVar206;
              auVar104 = minps(auVar104,auVar50);
              auVar245._4_4_ = fVar233;
              auVar245._0_4_ = fVar231;
              auVar245._8_4_ = fVar234;
              auVar245._12_4_ = fVar235;
              auVar46._4_4_ = fStack_834;
              auVar46._0_4_ = local_838;
              auVar46._8_4_ = fStack_830;
              auVar46._12_4_ = fStack_82c;
              auVar128 = maxps(auVar245,auVar46);
              auVar51._4_4_ = fVar122;
              auVar51._0_4_ = fVar202;
              auVar51._8_4_ = fVar124;
              auVar51._12_4_ = fVar206;
              auVar128 = maxps(auVar128,auVar51);
              local_8c8 = ABS(fVar221);
              fStack_8c4 = ABS(fVar201);
              fStack_8c0 = ABS(fVar223);
              fStack_8bc = ABS(fVar197);
              auVar246._4_4_ = -(uint)(auVar128._4_4_ <= fStack_8c4 * 1.1920929e-07);
              auVar246._0_4_ = -(uint)(auVar128._0_4_ <= local_8c8 * 1.1920929e-07);
              auVar246._8_4_ = -(uint)(auVar128._8_4_ <= fStack_8c0 * 1.1920929e-07);
              auVar246._12_4_ = -(uint)(auVar128._12_4_ <= fStack_8bc * 1.1920929e-07);
              auVar84._4_4_ = -(uint)(-(fStack_8c4 * 1.1920929e-07) <= auVar104._4_4_);
              auVar84._0_4_ = -(uint)(-(local_8c8 * 1.1920929e-07) <= auVar104._0_4_);
              auVar84._8_4_ = -(uint)(-(fStack_8c0 * 1.1920929e-07) <= auVar104._8_4_);
              auVar84._12_4_ = -(uint)(-(fStack_8bc * 1.1920929e-07) <= auVar104._12_4_);
              auVar246 = auVar246 | auVar84;
              uVar123 = movmskps((int)local_c00,auVar246);
              pRVar57 = (RTCRayN *)(ulong)uVar123;
              fStack_bd4 = fVar230;
              if (uVar123 != 0) {
                auVar172._0_4_ = local_818 * local_828 - fVar248 * local_808;
                auVar172._4_4_ = fStack_814 * fStack_824 - fVar249 * fStack_804;
                auVar172._8_4_ = fStack_810 * fStack_820 - fVar251 * fStack_800;
                auVar172._12_4_ = fStack_80c * fStack_81c - fVar253 * fStack_7fc;
                auVar257._0_4_ = fVar248 * fVar207 - fVar183 * local_828;
                auVar257._4_4_ = fVar249 * fVar209 - fVar194 * fStack_824;
                auVar257._8_4_ = fVar251 * fVar214 - fVar199 * fStack_820;
                auVar257._12_4_ = fVar253 * fVar217 - fVar204 * fStack_81c;
                auVar85._4_4_ = -(uint)(ABS(fVar249 * fStack_804) < ABS(fVar194 * fStack_824));
                auVar85._0_4_ = -(uint)(ABS(fVar248 * local_808) < ABS(fVar183 * local_828));
                auVar85._8_4_ = -(uint)(ABS(fVar251 * fStack_800) < ABS(fVar199 * fStack_820));
                auVar85._12_4_ = -(uint)(ABS(fVar253 * fStack_7fc) < ABS(fVar204 * fStack_81c));
                hit.UVW.field_0.v[1] = fVar201;
                hit.UVW.field_0.v[0] = fVar221;
                hit.UVW.field_0.v[2] = fVar223;
                hit.UVW.field_0.v[3] = fVar197;
                hit.vNg.field_0.field_0.x.field_0 =
                     (vfloat_impl<4>)blendvps(auVar257,auVar172,auVar85);
                auVar240._0_4_ = fVar239 * local_828 - fVar219 * fVar207;
                auVar240._4_4_ = fVar242 * fStack_824 - fVar161 * fVar209;
                auVar240._8_4_ = fVar243 * fStack_820 - fVar164 * fVar214;
                auVar240._12_4_ = fVar244 * fStack_81c - fVar166 * fVar217;
                auVar86._4_4_ = -(uint)(ABS(fVar222 * fStack_824) < ABS(fVar161 * fVar209));
                auVar86._0_4_ = -(uint)(ABS(fVar218 * local_828) < ABS(fVar219 * fVar207));
                auVar86._8_4_ = -(uint)(ABS(fVar163 * fStack_820) < ABS(fVar164 * fVar214));
                auVar86._12_4_ = -(uint)(ABS(fVar165 * fStack_81c) < ABS(fVar166 * fVar217));
                auVar47._4_4_ = fStack_804 * fVar161 - fVar222 * fStack_824;
                auVar47._0_4_ = local_808 * fVar219 - fVar218 * local_828;
                auVar47._8_4_ = fStack_800 * fVar164 - fVar163 * fStack_820;
                auVar47._12_4_ = fStack_7fc * fVar166 - fVar165 * fStack_81c;
                hit.vNg.field_0.field_0.y.field_0 =
                     (vfloat_impl<4>)blendvps(auVar240,auVar47,auVar86);
                auVar211._0_4_ = fVar218 * fVar248 - fVar219 * local_818;
                auVar211._4_4_ = fVar222 * fVar249 - fVar161 * fStack_814;
                auVar211._8_4_ = fVar163 * fVar251 - fVar164 * fStack_810;
                auVar211._12_4_ = fVar165 * fVar253 - fVar166 * fStack_80c;
                auVar237._0_4_ = fVar219 * fVar183 - fVar239 * fVar248;
                auVar237._4_4_ = fVar161 * fVar194 - fVar242 * fVar249;
                auVar237._8_4_ = fVar164 * fVar199 - fVar243 * fVar251;
                auVar237._12_4_ = fVar166 * fVar204 - fVar244 * fVar253;
                auVar87._4_4_ = -(uint)(ABS(fVar161 * fStack_814) < ABS(fVar242 * fVar249));
                auVar87._0_4_ = -(uint)(ABS(fVar219 * local_818) < ABS(fVar239 * fVar248));
                auVar87._8_4_ = -(uint)(ABS(fVar164 * fStack_810) < ABS(fVar243 * fVar251));
                auVar87._12_4_ = -(uint)(ABS(fVar166 * fStack_80c) < ABS(fVar244 * fVar253));
                hit.vNg.field_0.field_0.z.field_0 =
                     (vfloat_impl<4>)blendvps(auVar237,auVar211,auVar87);
                fVar202 = fVar176 * hit.vNg.field_0._0_4_ +
                          fVar102 * hit.vNg.field_0._16_4_ + fVar167 * hit.vNg.field_0._32_4_;
                fVar122 = fVar176 * hit.vNg.field_0._4_4_ +
                          fVar102 * hit.vNg.field_0._20_4_ + fVar167 * hit.vNg.field_0._36_4_;
                fVar124 = fVar176 * hit.vNg.field_0._8_4_ +
                          fVar102 * hit.vNg.field_0._24_4_ + fVar167 * hit.vNg.field_0._40_4_;
                fVar102 = fVar176 * hit.vNg.field_0._12_4_ +
                          fVar102 * hit.vNg.field_0._28_4_ + fVar167 * hit.vNg.field_0._44_4_;
                auVar155._0_4_ = fVar202 + fVar202;
                auVar155._4_4_ = fVar122 + fVar122;
                auVar155._8_4_ = fVar124 + fVar124;
                auVar155._12_4_ = fVar102 + fVar102;
                auVar109._0_4_ = fVar225 * hit.vNg.field_0._16_4_ + fVar196 * hit.vNg.field_0._32_4_
                ;
                auVar109._4_4_ = fVar226 * hit.vNg.field_0._20_4_ + fVar208 * hit.vNg.field_0._36_4_
                ;
                auVar109._8_4_ = fVar227 * hit.vNg.field_0._24_4_ + fVar213 * hit.vNg.field_0._40_4_
                ;
                auVar109._12_4_ =
                     fVar228 * hit.vNg.field_0._28_4_ + fVar215 * hit.vNg.field_0._44_4_;
                fVar122 = fVar182 * hit.vNg.field_0._0_4_ + auVar109._0_4_;
                fVar124 = fVar193 * hit.vNg.field_0._4_4_ + auVar109._4_4_;
                fVar206 = fVar198 * hit.vNg.field_0._8_4_ + auVar109._8_4_;
                fVar212 = fVar203 * hit.vNg.field_0._12_4_ + auVar109._12_4_;
                auVar104 = rcpps(auVar109,auVar155);
                fVar102 = auVar104._0_4_;
                fVar167 = auVar104._4_4_;
                fVar176 = auVar104._8_4_;
                fVar202 = auVar104._12_4_;
                hit.vt.field_0.v[0] =
                     ((1.0 - auVar155._0_4_ * fVar102) * fVar102 + fVar102) * (fVar122 + fVar122);
                hit.vt.field_0.v[1] =
                     ((1.0 - auVar155._4_4_ * fVar167) * fVar167 + fVar167) * (fVar124 + fVar124);
                hit.vt.field_0.v[2] =
                     ((1.0 - auVar155._8_4_ * fVar176) * fVar176 + fVar176) * (fVar206 + fVar206);
                hit.vt.field_0.v[3] =
                     ((1.0 - auVar155._12_4_ * fVar202) * fVar202 + fVar202) * (fVar212 + fVar212);
                fVar102 = *(float *)(local_c00 + k * 4 + 0x80);
                fVar167 = *(float *)(local_c00 + k * 4 + 0x30);
                auVar110._0_4_ =
                     -(uint)(hit.vt.field_0.v[0] <= fVar102 && fVar167 <= hit.vt.field_0.v[0]) &
                     auVar246._0_4_;
                auVar110._4_4_ =
                     -(uint)(hit.vt.field_0.v[1] <= fVar102 && fVar167 <= hit.vt.field_0.v[1]) &
                     auVar246._4_4_;
                auVar110._8_4_ =
                     -(uint)(hit.vt.field_0.v[2] <= fVar102 && fVar167 <= hit.vt.field_0.v[2]) &
                     auVar246._8_4_;
                auVar110._12_4_ =
                     -(uint)(hit.vt.field_0.v[3] <= fVar102 && fVar167 <= hit.vt.field_0.v[3]) &
                     auVar246._12_4_;
                uVar123 = movmskps(uVar123,auVar110);
                pRVar57 = (RTCRayN *)(ulong)uVar123;
                if (uVar123 != 0) {
                  uVar133 = -(uint)(auVar155._4_4_ != 0.0);
                  uVar134 = -(uint)(auVar155._8_4_ != 0.0);
                  uVar135 = -(uint)(auVar155._12_4_ != 0.0);
                  auVar156._4_4_ = uVar133;
                  auVar156._0_4_ = -(uint)(auVar155._0_4_ != 0.0);
                  auVar156._8_4_ = uVar134;
                  auVar156._12_4_ = uVar135;
                  hit.valid.field_0._0_4_ = auVar110._0_4_ & -(uint)(auVar155._0_4_ != 0.0);
                  hit.valid.field_0._4_4_ = auVar110._4_4_ & uVar133;
                  hit.valid.field_0._8_4_ = auVar110._8_4_ & uVar134;
                  hit.valid.field_0._12_4_ = auVar110._12_4_ & uVar135;
                  uVar123 = movmskps(uVar123,(undefined1  [16])hit.valid.field_0);
                  pRVar57 = (RTCRayN *)(ulong)uVar123;
                  if (uVar123 != 0) {
                    hit.mapUV = &mapUV;
                    auVar111._4_12_ = hit.valid.field_0._4_12_;
                    auVar111._0_4_ = (float)(int)(*(ushort *)(lVar27 + 8 + lVar59) - 1);
                    auVar147._4_4_ = hit.valid.field_0._4_4_;
                    auVar147._0_4_ = auVar111._0_4_;
                    auVar147._8_4_ = hit.valid.field_0._8_4_;
                    auVar147._12_4_ = hit.valid.field_0._12_4_;
                    auVar104 = rcpss(auVar147,auVar111);
                    auVar157._4_12_ = auVar156._4_12_;
                    auVar157._0_4_ = (float)(int)(*(ushort *)(lVar27 + 10 + lVar59) - 1);
                    fVar102 = (2.0 - auVar111._0_4_ * auVar104._0_4_) * auVar104._0_4_;
                    auVar148._4_4_ = uVar133;
                    auVar148._0_4_ = auVar157._0_4_;
                    auVar148._8_4_ = uVar134;
                    auVar148._12_4_ = uVar135;
                    auVar104 = rcpss(auVar148,auVar157);
                    fVar167 = (2.0 - auVar157._0_4_ * auVar104._0_4_) * auVar104._0_4_;
                    hit.U.field_0._0_4_ = fVar102 * ((float)uVar125 * fVar221 + fVar231);
                    hit.U.field_0._4_4_ = fVar102 * ((float)(uVar125 + 1) * fVar201 + fVar233);
                    hit.U.field_0._8_4_ = fVar102 * ((float)(uVar125 + 1) * fVar223 + fVar234);
                    hit.U.field_0._12_4_ = fVar102 * ((float)uVar125 * fVar197 + fVar235);
                    auVar131._0_4_ = (float)uVar127 * fVar221 + local_838;
                    auVar131._4_4_ = (float)uVar127 * fVar201 + fStack_834;
                    auVar131._8_4_ = (float)(uVar127 + 1) * fVar223 + fStack_830;
                    auVar131._12_4_ = (float)(uVar127 + 1) * fVar197 + fStack_82c;
                    hit.V.field_0._0_4_ = fVar167 * auVar131._0_4_;
                    hit.V.field_0._4_4_ = fVar167 * auVar131._4_4_;
                    hit.V.field_0._8_4_ = fVar167 * auVar131._8_4_;
                    hit.V.field_0._12_4_ = fVar167 * auVar131._12_4_;
                    pGVar26 = (context->scene->geometries).items[local_bf8].ptr;
                    pRVar57 = (RTCRayN *)(ulong)*(uint *)(local_c00 + k * 4 + 0x90);
                    if ((pGVar26->mask & *(uint *)(local_c00 + k * 4 + 0x90)) != 0) {
                      pRVar32 = context->args;
                      if ((pRVar32->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002ba410;
                      auVar104 = rcpps(auVar131,(undefined1  [16])hit.UVW.field_0);
                      fVar102 = auVar104._0_4_;
                      fVar167 = auVar104._4_4_;
                      fVar176 = auVar104._8_4_;
                      fVar202 = auVar104._12_4_;
                      fVar221 = (float)(-(uint)(1e-18 <= local_8c8) &
                                       (uint)(((float)DAT_01feca10 - fVar221 * fVar102) * fVar102 +
                                             fVar102));
                      fVar201 = (float)(-(uint)(1e-18 <= fStack_8c4) &
                                       (uint)((DAT_01feca10._4_4_ - fVar201 * fVar167) * fVar167 +
                                             fVar167));
                      fVar223 = (float)(-(uint)(1e-18 <= fStack_8c0) &
                                       (uint)((DAT_01feca10._8_4_ - fVar223 * fVar176) * fVar176 +
                                             fVar176));
                      fVar102 = (float)(-(uint)(1e-18 <= fStack_8bc) &
                                       (uint)((DAT_01feca10._12_4_ - fVar197 * fVar202) * fVar202 +
                                             fVar202));
                      auVar88._0_4_ = hit.U.field_0._0_4_ * fVar221;
                      auVar88._4_4_ = hit.U.field_0._4_4_ * fVar201;
                      auVar88._8_4_ = hit.U.field_0._8_4_ * fVar223;
                      auVar88._12_4_ = hit.U.field_0._12_4_ * fVar102;
                      hit.vu.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar88,_DAT_01feca10);
                      auVar112._0_4_ = hit.V.field_0._0_4_ * fVar221;
                      auVar112._4_4_ = hit.V.field_0._4_4_ * fVar201;
                      auVar112._8_4_ = hit.V.field_0._8_4_ * fVar223;
                      auVar112._12_4_ = hit.V.field_0._12_4_ * fVar102;
                      hit.vv.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar112,_DAT_01feca10);
                      iVar54 = movmskps((int)pRVar32,(undefined1  [16])hit.valid.field_0);
                      local_cd8 = (RTCRayN *)CONCAT44((int)((ulong)pRVar32 >> 0x20),iVar54);
                      pRVar56 = (RTCRayN *)0x0;
                      if (local_cd8 != (RTCRayN *)0x0) {
                        for (; ((ulong)local_cd8 >> (long)pRVar56 & 1) == 0; pRVar56 = pRVar56 + 1)
                        {
                        }
                      }
                      bVar79 = iVar54 == 0;
                      pRVar57 = local_cd8;
                      if (!bVar79) {
                        auVar53 = *(undefined1 (*) [12])*local_bb0;
                        uStack_c2c = (undefined4)((ulong)*(undefined8 *)(*local_bb0 + 8) >> 0x20);
                        local_be8 = (float)uVar121;
                        fStack_be4 = (float)uVar121;
                        fStack_be0 = (float)uVar121;
                        fStack_bdc = (float)uVar121;
                        do {
                          uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_928 = hit.vu.field_0.v[(long)pRVar56];
                          iVar54 = hit.vv.field_0.i[(long)pRVar56];
                          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[(long)pRVar56];
                          args.context = context->user;
                          local_918._4_4_ = iVar54;
                          local_918._0_4_ = iVar54;
                          local_918._8_4_ = iVar54;
                          local_918._12_4_ = iVar54;
                          local_958 = *(undefined4 *)((long)&hit.vNg.field_0 + (long)pRVar56 * 4);
                          uVar22 = *(undefined4 *)
                                    ((long)&hit.vNg.field_0 + (long)pRVar56 * 4 + 0x10);
                          uVar23 = *(undefined4 *)
                                    ((long)&hit.vNg.field_0 + (long)pRVar56 * 4 + 0x20);
                          local_948._4_4_ = uVar22;
                          local_948._0_4_ = uVar22;
                          local_948._8_4_ = uVar22;
                          local_948._12_4_ = uVar22;
                          local_938._4_4_ = uVar23;
                          local_938._0_4_ = uVar23;
                          local_938._8_4_ = uVar23;
                          local_938._12_4_ = uVar23;
                          uStack_954 = local_958;
                          uStack_950 = local_958;
                          uStack_94c = local_958;
                          fStack_924 = local_928;
                          fStack_920 = local_928;
                          fStack_91c = local_928;
                          local_908 = CONCAT44(fStack_be4,local_be8);
                          uStack_900 = CONCAT44(fStack_bdc,fStack_be0);
                          local_8f8 = CONCAT44(uVar103,uVar103);
                          uStack_8f0 = CONCAT44(uVar103,uVar103);
                          local_8e8 = (args.context)->instID[0];
                          uStack_8e4 = local_8e8;
                          uStack_8e0 = local_8e8;
                          uStack_8dc = local_8e8;
                          local_8d8 = (args.context)->instPrimID[0];
                          uStack_8d4 = local_8d8;
                          uStack_8d0 = local_8d8;
                          uStack_8cc = local_8d8;
                          local_c18._12_4_ = uStack_c2c;
                          local_c18._0_12_ = auVar53;
                          args.valid = (int *)local_c18;
                          args.geometryUserPtr = pGVar26->userPtr;
                          args.ray = (RTCRayN *)local_c00;
                          args.hit = (RTCHitN *)&local_958;
                          args.N = 4;
                          pRVar57 = (RTCRayN *)pGVar26->occlusionFilterN;
                          if (pRVar57 != (RTCRayN *)0x0) {
                            pRVar57 = (RTCRayN *)(*(code *)pRVar57)(&args);
                          }
                          if (local_c18 == (undefined1  [16])0x0) {
                            auVar113._8_4_ = 0xffffffff;
                            auVar113._0_8_ = 0xffffffffffffffff;
                            auVar113._12_4_ = 0xffffffff;
                            auVar113 = auVar113 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var33 = context->args->filter;
                            if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var33)(&args);
                            }
                            auVar89._0_4_ = -(uint)(local_c18._0_4_ == 0);
                            auVar89._4_4_ = -(uint)(local_c18._4_4_ == 0);
                            auVar89._8_4_ = -(uint)(local_c18._8_4_ == 0);
                            auVar89._12_4_ = -(uint)(local_c18._12_4_ == 0);
                            auVar113 = auVar89 ^ _DAT_01febe20;
                            auVar104 = blendvps(_DAT_01feba00,
                                                *(undefined1 (*) [16])(args.ray + 0x80),auVar89);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar104;
                            pRVar57 = args.ray;
                          }
                          if ((_DAT_01fecb20 & auVar113) != (undefined1  [16])0x0) {
                            if (!bVar79) goto LAB_002ba410;
                            break;
                          }
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar63;
                          local_cd8 = (RTCRayN *)((ulong)local_cd8 ^ 1L << ((ulong)pRVar56 & 0x3f));
                          pRVar56 = (RTCRayN *)0x0;
                          if (local_cd8 != (RTCRayN *)0x0) {
                            for (; ((ulong)local_cd8 >> (long)pRVar56 & 1) == 0;
                                pRVar56 = pRVar56 + 1) {
                            }
                          }
                          bVar79 = local_cd8 == (RTCRayN *)0x0;
                          pRVar57 = pRVar56;
                        } while (!bVar79);
                      }
                    }
                  }
                }
              }
              fVar221 = *(float *)(ray + k * 4);
              fVar201 = *(float *)(ray + k * 4 + 0x10);
              fVar223 = *(float *)(ray + k * 4 + 0x20);
              fVar230 = fVar230 - fVar221;
              fVar239 = local_878 - fVar221;
              fVar243 = (local_898 * ((float)local_8b8 - (float)local_888) + (float)local_888) -
                        fVar221;
              fVar248 = local_8a8 - fVar221;
              fVar232 = fVar232 - fVar201;
              fVar214 = fStack_874 - fVar201;
              fVar217 = (fStack_894 * (local_8b8._4_4_ - local_888._4_4_) + local_888._4_4_) -
                        fVar201;
              fVar219 = fStack_8a4 - fVar201;
              fVar204 = fVar160 - fVar223;
              fVar226 = fStack_870 - fVar223;
              fVar228 = (fStack_890 * ((float)uStack_8b0 - (float)uStack_880) + (float)uStack_880) -
                        fVar223;
              fVar233 = fStack_8a0 - fVar223;
              local_bd8 = local_bd8 - fVar221;
              fStack_bd4 = fStack_bd4 - fVar221;
              fStack_bd0 = fStack_bd0 - fVar221;
              fStack_bcc = fStack_bcc - fVar221;
              fVar176 = (float)local_bc8._0_4_ - fVar201;
              fVar202 = (float)local_bc8._4_4_ - fVar201;
              fVar124 = fStack_bc0 - fVar201;
              fVar216 = fStack_bbc - fVar201;
              fVar191 = fVar191 - fVar223;
              fVar160 = fVar160 - fVar223;
              fVar206 = fStack_ca0 - fVar223;
              fVar126 = fStack_c9c - fVar223;
              fVar197 = (float)local_858 - fVar221;
              fVar122 = local_858._4_4_ - fVar221;
              fVar212 = fStack_850 - fVar221;
              fVar221 = fStack_84c - fVar221;
              fVar180 = local_868 - fVar201;
              fVar195 = fStack_864 - fVar201;
              fVar220 = fStack_860 - fVar201;
              fVar201 = fStack_85c - fVar201;
              fVar255 = local_848 - fVar223;
              fVar258 = fStack_844 - fVar223;
              fVar260 = fStack_840 - fVar223;
              fVar223 = fStack_83c - fVar223;
              fVar162 = fVar197 - fVar230;
              fVar200 = fVar122 - fVar239;
              fVar181 = fVar212 - fVar243;
              fVar192 = fVar221 - fVar248;
              local_be8 = fVar180 - fVar232;
              fStack_be4 = fVar195 - fVar214;
              fStack_be0 = fVar220 - fVar217;
              fStack_bdc = fVar201 - fVar219;
              fVar161 = fVar255 - fVar204;
              fVar165 = fVar258 - fVar226;
              fVar183 = fVar260 - fVar228;
              fVar198 = fVar223 - fVar233;
              fVar102 = *(float *)(ray + k * 4 + 0x50);
              fStack_ca0 = *(float *)(ray + k * 4 + 0x60);
              fVar167 = *(float *)(ray + k * 4 + 0x40);
              local_bc8._4_4_ = fVar167;
              local_bc8._0_4_ = fVar167;
              fVar196 = (local_be8 * (fVar255 + fVar204) - (fVar180 + fVar232) * fVar161) * fVar167
                        + ((fVar197 + fVar230) * fVar161 - (fVar255 + fVar204) * fVar162) * fVar102
                          + (fVar162 * (fVar180 + fVar232) - (fVar197 + fVar230) * local_be8) *
                            fStack_ca0;
              fVar207 = (fStack_be4 * (fVar258 + fVar226) - (fVar195 + fVar214) * fVar165) * fVar167
                        + ((fVar122 + fVar239) * fVar165 - (fVar258 + fVar226) * fVar200) * fVar102
                          + (fVar200 * (fVar195 + fVar214) - (fVar122 + fVar239) * fStack_be4) *
                            fStack_ca0;
              fVar208 = (fStack_be0 * (fVar260 + fVar228) - (fVar220 + fVar217) * fVar183) * fVar167
                        + ((fVar212 + fVar243) * fVar183 - (fVar260 + fVar228) * fVar181) * fVar102
                          + (fVar181 * (fVar220 + fVar217) - (fVar212 + fVar243) * fStack_be0) *
                            fStack_ca0;
              fVar209 = (fStack_bdc * (fVar223 + fVar233) - (fVar201 + fVar219) * fVar198) * fVar167
                        + ((fVar221 + fVar248) * fVar198 - (fVar223 + fVar233) * fVar192) * fVar102
                          + (fVar192 * (fVar201 + fVar219) - (fVar221 + fVar248) * fStack_bdc) *
                            fStack_ca0;
              fVar256 = fVar230 - local_bd8;
              fVar259 = fVar239 - fStack_bd4;
              fVar261 = fVar243 - fStack_bd0;
              fVar262 = fVar248 - fStack_bcc;
              fVar250 = fVar232 - fVar176;
              fVar251 = fVar214 - fVar202;
              fVar252 = fVar217 - fVar124;
              fVar253 = fVar219 - fVar216;
              fVar163 = fVar204 - fVar191;
              fVar166 = fVar226 - fVar160;
              fVar193 = fVar228 - fVar206;
              fVar199 = fVar233 - fVar126;
              fVar225 = (fVar250 * (fVar204 + fVar191) - (fVar232 + fVar176) * fVar163) * fVar167 +
                        ((fVar230 + local_bd8) * fVar163 - (fVar204 + fVar191) * fVar256) * fVar102
                        + (fVar256 * (fVar232 + fVar176) - (fVar230 + local_bd8) * fVar250) *
                          fStack_ca0;
              fVar227 = (fVar251 * (fVar226 + fVar160) - (fVar214 + fVar202) * fVar166) * fVar167 +
                        ((fVar239 + fStack_bd4) * fVar166 - (fVar226 + fVar160) * fVar259) * fVar102
                        + (fVar259 * (fVar214 + fVar202) - (fVar239 + fStack_bd4) * fVar251) *
                          fStack_ca0;
              fVar231 = (fVar252 * (fVar228 + fVar206) - (fVar217 + fVar124) * fVar193) * fVar167 +
                        ((fVar243 + fStack_bd0) * fVar193 - (fVar228 + fVar206) * fVar261) * fVar102
                        + (fVar261 * (fVar217 + fVar124) - (fVar243 + fStack_bd0) * fVar252) *
                          fStack_ca0;
              fVar234 = (fVar253 * (fVar233 + fVar126) - (fVar219 + fVar216) * fVar199) * fVar167 +
                        ((fVar248 + fStack_bcc) * fVar199 - (fVar233 + fVar126) * fVar262) * fVar102
                        + (fVar262 * (fVar219 + fVar216) - (fVar248 + fStack_bcc) * fVar253) *
                          fStack_ca0;
              fVar235 = local_bd8 - fVar197;
              fVar242 = fStack_bd4 - fVar122;
              fVar244 = fStack_bd0 - fVar212;
              fVar249 = fStack_bcc - fVar221;
              fVar164 = fVar176 - fVar180;
              fVar182 = fVar202 - fVar195;
              fVar194 = fVar124 - fVar220;
              fVar203 = fVar216 - fVar201;
              fVar213 = fVar191 - fVar255;
              fVar215 = fVar160 - fVar258;
              fVar218 = fVar206 - fVar260;
              fVar222 = fVar126 - fVar223;
              fStack_bc0 = fVar167;
              fStack_bbc = fVar167;
              auVar90._0_4_ =
                   (fVar164 * (fVar255 + fVar191) - (fVar180 + fVar176) * fVar213) * fVar167 +
                   ((fVar197 + local_bd8) * fVar213 - (fVar255 + fVar191) * fVar235) * fVar102 +
                   (fVar235 * (fVar180 + fVar176) - (fVar197 + local_bd8) * fVar164) * fStack_ca0;
              auVar90._4_4_ =
                   (fVar182 * (fVar258 + fVar160) - (fVar195 + fVar202) * fVar215) * fVar167 +
                   ((fVar122 + fStack_bd4) * fVar215 - (fVar258 + fVar160) * fVar242) * fVar102 +
                   (fVar242 * (fVar195 + fVar202) - (fVar122 + fStack_bd4) * fVar182) * fStack_ca0;
              auVar90._8_4_ =
                   (fVar194 * (fVar260 + fVar206) - (fVar220 + fVar124) * fVar218) * fVar167 +
                   ((fVar212 + fStack_bd0) * fVar218 - (fVar260 + fVar206) * fVar244) * fVar102 +
                   (fVar244 * (fVar220 + fVar124) - (fVar212 + fStack_bd0) * fVar194) * fStack_ca0;
              auVar90._12_4_ =
                   (fVar203 * (fVar223 + fVar126) - (fVar201 + fVar216) * fVar222) * fVar167 +
                   ((fVar221 + fStack_bcc) * fVar222 - (fVar223 + fVar126) * fVar249) * fVar102 +
                   (fVar249 * (fVar201 + fVar216) - (fVar221 + fStack_bcc) * fVar203) * fStack_ca0;
              fVar197 = fVar196 + fVar225 + auVar90._0_4_;
              fVar202 = fVar207 + fVar227 + auVar90._4_4_;
              hit.UVW.field_0._0_8_ = CONCAT44(fVar202,fVar197);
              hit.UVW.field_0.v[2] = fVar208 + fVar231 + auVar90._8_4_;
              hit.UVW.field_0.v[3] = fVar209 + fVar234 + auVar90._12_4_;
              auVar114._8_4_ = fVar208;
              auVar114._0_8_ = CONCAT44(fVar207,fVar196);
              auVar114._12_4_ = fVar209;
              auVar48._4_4_ = fVar227;
              auVar48._0_4_ = fVar225;
              auVar48._8_4_ = fVar231;
              auVar48._12_4_ = fVar234;
              auVar104 = minps(auVar114,auVar48);
              auVar104 = minps(auVar104,auVar90);
              auVar158._8_4_ = fVar208;
              auVar158._0_8_ = CONCAT44(fVar207,fVar196);
              auVar158._12_4_ = fVar209;
              auVar49._4_4_ = fVar227;
              auVar49._0_4_ = fVar225;
              auVar49._8_4_ = fVar231;
              auVar49._12_4_ = fVar234;
              auVar128 = maxps(auVar158,auVar49);
              auVar128 = maxps(auVar128,auVar90);
              fVar221 = ABS(fVar197) * 1.1920929e-07;
              fVar201 = ABS(fVar202) * 1.1920929e-07;
              fVar223 = ABS(hit.UVW.field_0.v[2]) * 1.1920929e-07;
              fVar176 = ABS(hit.UVW.field_0.v[3]) * 1.1920929e-07;
              auVar159._4_4_ = -(uint)(auVar128._4_4_ <= fVar201);
              auVar159._0_4_ = -(uint)(auVar128._0_4_ <= fVar221);
              auVar159._8_4_ = -(uint)(auVar128._8_4_ <= fVar223);
              auVar159._12_4_ = -(uint)(auVar128._12_4_ <= fVar176);
              auVar115._4_4_ = -(uint)(-fVar201 <= auVar104._4_4_);
              auVar115._0_4_ = -(uint)(-fVar221 <= auVar104._0_4_);
              auVar115._8_4_ = -(uint)(-fVar223 <= auVar104._8_4_);
              auVar115._12_4_ = -(uint)(-fVar176 <= auVar104._12_4_);
              auVar159 = auVar159 | auVar115;
              iVar54 = movmskps((int)pRVar57,auVar159);
              fStack_c9c = fStack_ca0;
              if (iVar54 != 0) {
                _local_bd8 = CONCAT44(fVar182,fVar164);
                auVar189._0_4_ = local_be8 * fVar163 - fVar250 * fVar161;
                auVar189._4_4_ = fStack_be4 * fVar166 - fVar251 * fVar165;
                auVar189._8_4_ = fStack_be0 * fVar193 - fVar252 * fVar183;
                auVar189._12_4_ = fStack_bdc * fVar199 - fVar253 * fVar198;
                auVar238._0_4_ = fVar250 * fVar213 - fVar164 * fVar163;
                auVar238._4_4_ = fVar251 * fVar215 - fVar182 * fVar166;
                auVar238._8_4_ = fVar252 * fVar218 - fVar194 * fVar193;
                auVar238._12_4_ = fVar253 * fVar222 - fVar203 * fVar199;
                auVar91._4_4_ = -(uint)(ABS(fVar251 * fVar165) < ABS(fVar182 * fVar166));
                auVar91._0_4_ = -(uint)(ABS(fVar250 * fVar161) < ABS(fVar164 * fVar163));
                auVar91._8_4_ = -(uint)(ABS(fVar252 * fVar183) < ABS(fVar194 * fVar193));
                auVar91._12_4_ = -(uint)(ABS(fVar253 * fVar198) < ABS(fVar203 * fVar199));
                hit.vNg.field_0.field_0.x.field_0 =
                     (vfloat_impl<4>)blendvps(auVar238,auVar189,auVar91);
                auVar149._0_4_ = fVar161 * fVar256 - fVar162 * fVar163;
                auVar149._4_4_ = fVar165 * fVar259 - fVar200 * fVar166;
                auVar149._8_4_ = fVar183 * fVar261 - fVar181 * fVar193;
                auVar149._12_4_ = fVar198 * fVar262 - fVar192 * fVar199;
                auVar241._0_4_ = fVar235 * fVar163 - fVar256 * fVar213;
                auVar241._4_4_ = fVar242 * fVar166 - fVar259 * fVar215;
                auVar241._8_4_ = fVar244 * fVar193 - fVar261 * fVar218;
                auVar241._12_4_ = fVar249 * fVar199 - fVar262 * fVar222;
                auVar92._4_4_ = -(uint)(ABS(fVar200 * fVar166) < ABS(fVar259 * fVar215));
                auVar92._0_4_ = -(uint)(ABS(fVar162 * fVar163) < ABS(fVar256 * fVar213));
                auVar92._8_4_ = -(uint)(ABS(fVar181 * fVar193) < ABS(fVar261 * fVar218));
                auVar92._12_4_ = -(uint)(ABS(fVar192 * fVar199) < ABS(fVar262 * fVar222));
                hit.vNg.field_0.field_0.y.field_0 =
                     (vfloat_impl<4>)blendvps(auVar241,auVar149,auVar92);
                auVar140._0_4_ = fVar162 * fVar250 - fVar256 * local_be8;
                auVar140._4_4_ = fVar200 * fVar251 - fVar259 * fStack_be4;
                auVar140._8_4_ = fVar181 * fVar252 - fVar261 * fStack_be0;
                auVar140._12_4_ = fVar192 * fVar253 - fVar262 * fStack_bdc;
                auVar247._0_4_ = fVar256 * fVar164 - fVar235 * fVar250;
                auVar247._4_4_ = fVar259 * fVar182 - fVar242 * fVar251;
                auVar247._8_4_ = fVar261 * fVar194 - fVar244 * fVar252;
                auVar247._12_4_ = fVar262 * fVar203 - fVar249 * fVar253;
                auVar93._4_4_ = -(uint)(ABS(fVar259 * fStack_be4) < ABS(fVar242 * fVar251));
                auVar93._0_4_ = -(uint)(ABS(fVar256 * local_be8) < ABS(fVar235 * fVar250));
                auVar93._8_4_ = -(uint)(ABS(fVar261 * fStack_be0) < ABS(fVar244 * fVar252));
                auVar93._12_4_ = -(uint)(ABS(fVar262 * fStack_bdc) < ABS(fVar249 * fVar253));
                hit.vNg.field_0.field_0.z.field_0 =
                     (vfloat_impl<4>)blendvps(auVar247,auVar140,auVar93);
                fVar221 = fVar167 * hit.vNg.field_0._0_4_ +
                          fVar102 * hit.vNg.field_0._16_4_ + fStack_ca0 * hit.vNg.field_0._32_4_;
                fVar201 = fVar167 * hit.vNg.field_0._4_4_ +
                          fVar102 * hit.vNg.field_0._20_4_ + fStack_ca0 * hit.vNg.field_0._36_4_;
                fVar223 = fVar167 * hit.vNg.field_0._8_4_ +
                          fVar102 * hit.vNg.field_0._24_4_ + fStack_ca0 * hit.vNg.field_0._40_4_;
                fVar102 = fVar167 * hit.vNg.field_0._12_4_ +
                          fVar102 * hit.vNg.field_0._28_4_ + fStack_ca0 * hit.vNg.field_0._44_4_;
                auVar150._0_4_ = fVar221 + fVar221;
                auVar150._4_4_ = fVar201 + fVar201;
                auVar150._8_4_ = fVar223 + fVar223;
                auVar150._12_4_ = fVar102 + fVar102;
                auVar116._0_4_ = fVar232 * hit.vNg.field_0._16_4_ + fVar204 * hit.vNg.field_0._32_4_
                ;
                auVar116._4_4_ = fVar214 * hit.vNg.field_0._20_4_ + fVar226 * hit.vNg.field_0._36_4_
                ;
                auVar116._8_4_ = fVar217 * hit.vNg.field_0._24_4_ + fVar228 * hit.vNg.field_0._40_4_
                ;
                auVar116._12_4_ =
                     fVar219 * hit.vNg.field_0._28_4_ + fVar233 * hit.vNg.field_0._44_4_;
                fVar167 = fVar230 * hit.vNg.field_0._0_4_ + auVar116._0_4_;
                fVar176 = fVar239 * hit.vNg.field_0._4_4_ + auVar116._4_4_;
                fVar122 = fVar243 * hit.vNg.field_0._8_4_ + auVar116._8_4_;
                fVar124 = fVar248 * hit.vNg.field_0._12_4_ + auVar116._12_4_;
                auVar104 = rcpps(auVar116,auVar150);
                fVar221 = auVar104._0_4_;
                fVar201 = auVar104._4_4_;
                fVar223 = auVar104._8_4_;
                fVar102 = auVar104._12_4_;
                hit.vt.field_0.v[0] =
                     ((1.0 - auVar150._0_4_ * fVar221) * fVar221 + fVar221) * (fVar167 + fVar167);
                hit.vt.field_0.v[1] =
                     ((1.0 - auVar150._4_4_ * fVar201) * fVar201 + fVar201) * (fVar176 + fVar176);
                hit.vt.field_0.v[2] =
                     ((1.0 - auVar150._8_4_ * fVar223) * fVar223 + fVar223) * (fVar122 + fVar122);
                hit.vt.field_0.v[3] =
                     ((1.0 - auVar150._12_4_ * fVar102) * fVar102 + fVar102) * (fVar124 + fVar124);
                fVar221 = *(float *)(ray + k * 4 + 0x80);
                fVar201 = *(float *)(ray + k * 4 + 0x30);
                auVar117._0_4_ =
                     -(uint)(hit.vt.field_0.v[0] <= fVar221 && fVar201 <= hit.vt.field_0.v[0]) &
                     auVar159._0_4_;
                auVar117._4_4_ =
                     -(uint)(hit.vt.field_0.v[1] <= fVar221 && fVar201 <= hit.vt.field_0.v[1]) &
                     auVar159._4_4_;
                auVar117._8_4_ =
                     -(uint)(hit.vt.field_0.v[2] <= fVar221 && fVar201 <= hit.vt.field_0.v[2]) &
                     auVar159._8_4_;
                auVar117._12_4_ =
                     -(uint)(hit.vt.field_0.v[3] <= fVar221 && fVar201 <= hit.vt.field_0.v[3]) &
                     auVar159._12_4_;
                iVar54 = movmskps(iVar54,auVar117);
                fStack_bd0 = fVar194;
                fStack_bcc = fVar203;
                if (iVar54 != 0) {
                  hit.valid.field_0._0_4_ = auVar117._0_4_ & -(uint)(auVar150._0_4_ != 0.0);
                  hit.valid.field_0._4_4_ = auVar117._4_4_ & -(uint)(auVar150._4_4_ != 0.0);
                  hit.valid.field_0._8_4_ = auVar117._8_4_ & -(uint)(auVar150._8_4_ != 0.0);
                  hit.valid.field_0._12_4_ = auVar117._12_4_ & -(uint)(auVar150._12_4_ != 0.0);
                  iVar54 = movmskps(iVar54,(undefined1  [16])hit.valid.field_0);
                  if (iVar54 != 0) {
                    hit.mapUV = &mapUV;
                    auVar132._0_4_ = fVar197 - fVar225;
                    auVar132._4_4_ = fVar202 - fVar227;
                    auVar132._8_4_ = hit.UVW.field_0.v[2] - fVar231;
                    auVar132._12_4_ = hit.UVW.field_0.v[3] - fVar234;
                    auVar118._4_12_ = hit.valid.field_0._4_12_;
                    auVar118._0_4_ = (float)(int)(*(ushort *)(lVar27 + 8 + lVar59) - 1);
                    auVar173._4_4_ = hit.valid.field_0._4_4_;
                    auVar173._0_4_ = auVar118._0_4_;
                    auVar173._8_4_ = hit.valid.field_0._8_4_;
                    auVar173._12_4_ = hit.valid.field_0._12_4_;
                    auVar104 = rcpss(auVar173,auVar118);
                    fVar221 = (2.0 - auVar118._0_4_ * auVar104._0_4_) * auVar104._0_4_;
                    auVar174._4_12_ = auVar104._4_12_;
                    auVar174._0_4_ = (float)(int)(*(ushort *)(lVar27 + 10 + lVar59) - 1);
                    auVar190._4_4_ = auVar104._4_4_;
                    auVar190._0_4_ = auVar174._0_4_;
                    auVar190._8_4_ = auVar104._8_4_;
                    auVar190._12_4_ = auVar104._12_4_;
                    auVar104 = rcpss(auVar190,auVar174);
                    fVar201 = (2.0 - auVar174._0_4_ * auVar104._0_4_) * auVar104._0_4_;
                    hit.U.field_0._0_4_ = fVar221 * ((float)uVar125 * fVar197 + (fVar197 - fVar196))
                    ;
                    hit.U.field_0._4_4_ =
                         fVar221 * ((float)(uVar125 + 1) * fVar202 + (fVar202 - fVar207));
                    hit.U.field_0._8_4_ =
                         fVar221 * ((float)(uVar125 + 1) * hit.UVW.field_0.v[2] +
                                   (hit.UVW.field_0.v[2] - fVar208));
                    hit.U.field_0._12_4_ =
                         fVar221 * ((float)uVar125 * hit.UVW.field_0.v[3] +
                                   (hit.UVW.field_0.v[3] - fVar209));
                    hit.V.field_0._0_4_ = fVar201 * ((float)uVar127 * fVar197 + auVar132._0_4_);
                    hit.V.field_0._4_4_ = fVar201 * ((float)uVar127 * fVar202 + auVar132._4_4_);
                    hit.V.field_0._8_4_ =
                         fVar201 * ((float)(uVar127 + 1) * hit.UVW.field_0.v[2] + auVar132._8_4_);
                    hit.V.field_0._12_4_ =
                         fVar201 * ((float)(uVar127 + 1) * hit.UVW.field_0.v[3] + auVar132._12_4_);
                    pGVar26 = (context->scene->geometries).items[local_bf8].ptr;
                    if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar175._8_4_ = hit.UVW.field_0.i[2];
                      auVar175._0_8_ = hit.UVW.field_0._0_8_;
                      auVar175._12_4_ = hit.UVW.field_0.i[3];
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar26->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002ba410;
                      auVar104 = rcpps(auVar132,auVar175);
                      fVar221 = auVar104._0_4_;
                      fVar201 = auVar104._4_4_;
                      fVar223 = auVar104._8_4_;
                      fVar102 = auVar104._12_4_;
                      fVar221 = (float)(-(uint)(1e-18 <= ABS(fVar197)) &
                                       (uint)(((float)DAT_01feca10 - fVar197 * fVar221) * fVar221 +
                                             fVar221));
                      fVar201 = (float)(-(uint)(1e-18 <= ABS(fVar202)) &
                                       (uint)((DAT_01feca10._4_4_ - fVar202 * fVar201) * fVar201 +
                                             fVar201));
                      fVar223 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[2])) &
                                       (uint)((DAT_01feca10._8_4_ - hit.UVW.field_0.v[2] * fVar223)
                                              * fVar223 + fVar223));
                      fVar102 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[3])) &
                                       (uint)((DAT_01feca10._12_4_ - hit.UVW.field_0.v[3] * fVar102)
                                              * fVar102 + fVar102));
                      auVar94._0_4_ = hit.U.field_0._0_4_ * fVar221;
                      auVar94._4_4_ = hit.U.field_0._4_4_ * fVar201;
                      auVar94._8_4_ = hit.U.field_0._8_4_ * fVar223;
                      auVar94._12_4_ = hit.U.field_0._12_4_ * fVar102;
                      hit.vu.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar94,_DAT_01feca10);
                      auVar119._0_4_ = hit.V.field_0._0_4_ * fVar221;
                      auVar119._4_4_ = hit.V.field_0._4_4_ * fVar201;
                      auVar119._8_4_ = hit.V.field_0._8_4_ * fVar223;
                      auVar119._12_4_ = hit.V.field_0._12_4_ * fVar102;
                      hit.vv.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar119,_DAT_01feca10);
                      uVar63 = (undefined4)local_bf8;
                      iVar54 = movmskps(uVar63,(undefined1  [16])hit.valid.field_0);
                      uVar60 = CONCAT44((int)(local_bf8 >> 0x20),iVar54);
                      uVar58 = 0;
                      if (uVar60 != 0) {
                        for (; (uVar60 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                        }
                      }
                      bVar79 = iVar54 == 0;
                      if (!bVar79) {
                        local_bf8 = CONCAT44(uVar63,uVar63);
                        local_b58 = CONCAT44(uVar121,uVar121);
                        auVar104 = *local_bb0;
                        uStack_bf0 = uVar63;
                        uStack_bec = uVar63;
                        do {
                          uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_928 = hit.vu.field_0.v[uVar58];
                          iVar54 = hit.vv.field_0.i[uVar58];
                          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar58];
                          args.context = context->user;
                          local_918._4_4_ = iVar54;
                          local_918._0_4_ = iVar54;
                          local_918._8_4_ = iVar54;
                          local_918._12_4_ = iVar54;
                          local_958 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar58 * 4);
                          uVar22 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar58 * 4 + 0x10);
                          uVar23 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar58 * 4 + 0x20);
                          local_948._4_4_ = uVar22;
                          local_948._0_4_ = uVar22;
                          local_948._8_4_ = uVar22;
                          local_948._12_4_ = uVar22;
                          local_938._4_4_ = uVar23;
                          local_938._0_4_ = uVar23;
                          local_938._8_4_ = uVar23;
                          local_938._12_4_ = uVar23;
                          uStack_954 = local_958;
                          uStack_950 = local_958;
                          uStack_94c = local_958;
                          fStack_924 = local_928;
                          fStack_920 = local_928;
                          fStack_91c = local_928;
                          local_908 = local_b58;
                          uStack_900 = CONCAT44(uVar121,uVar121);
                          local_8f8 = local_bf8;
                          uStack_8f0 = CONCAT44(uStack_bec,uStack_bf0);
                          local_8e8 = (args.context)->instID[0];
                          uStack_8e4 = local_8e8;
                          uStack_8e0 = local_8e8;
                          uStack_8dc = local_8e8;
                          local_8d8 = (args.context)->instPrimID[0];
                          uStack_8d4 = local_8d8;
                          uStack_8d0 = local_8d8;
                          uStack_8cc = local_8d8;
                          args.valid = (int *)local_c18;
                          args.geometryUserPtr = pGVar26->userPtr;
                          args.ray = (RTCRayN *)local_c00;
                          args.hit = (RTCHitN *)&local_958;
                          args.N = 4;
                          local_c18 = auVar104;
                          if (pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar26->occlusionFilterN)(&args);
                          }
                          if (local_c18 == (undefined1  [16])0x0) {
                            auVar120._8_4_ = 0xffffffff;
                            auVar120._0_8_ = 0xffffffffffffffff;
                            auVar120._12_4_ = 0xffffffff;
                            auVar120 = auVar120 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var33 = context->args->filter;
                            if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var33)(&args);
                            }
                            auVar95._0_4_ = -(uint)(local_c18._0_4_ == 0);
                            auVar95._4_4_ = -(uint)(local_c18._4_4_ == 0);
                            auVar95._8_4_ = -(uint)(local_c18._8_4_ == 0);
                            auVar95._12_4_ = -(uint)(local_c18._12_4_ == 0);
                            auVar120 = auVar95 ^ _DAT_01febe20;
                            auVar128 = blendvps(_DAT_01feba00,
                                                *(undefined1 (*) [16])(args.ray + 0x80),auVar95);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar128;
                          }
                          if ((_DAT_01fecb20 & auVar120) != (undefined1  [16])0x0) {
                            if (!bVar79) goto LAB_002ba410;
                            break;
                          }
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar63;
                          uVar60 = uVar60 ^ 1L << (uVar58 & 0x3f);
                          uVar58 = 0;
                          if (uVar60 != 0) {
                            for (; (uVar60 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                            }
                          }
                          bVar79 = uVar60 == 0;
                        } while (!bVar79);
                      }
                    }
                  }
                }
              }
              uVar61 = uVar61 & uVar61 - 1;
              pRVar75 = ray;
            } while (uVar61 != 0);
          }
          uVar55 = uVar55 + 1;
          bVar78 = uVar55 < uVar66;
        } while (uVar55 != uVar66);
      }
LAB_002ba410:
      uVar103 = 0;
      if (bVar78) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar103 = 1;
      }
    }
  } while ((uVar103 & 3) == 0);
  return pNVar64 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }